

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LDSketch.cpp
# Opt level: O3

void * safe_calloc(size_t nmemb,size_t size,char *name)

{
  uint uVar1;
  void *pvVar2;
  long lVar3;
  int in_ECX;
  int iVar4;
  int iVar5;
  ulong extraout_RDX;
  ulong uVar6;
  int in_R8D;
  byte abStack_40 [56];
  
  abStack_40[0x30] = 0xd1;
  abStack_40[0x31] = 0x49;
  abStack_40[0x32] = 0x10;
  abStack_40[0x33] = 0;
  abStack_40[0x34] = 0;
  abStack_40[0x35] = 0;
  abStack_40[0x36] = 0;
  abStack_40[0x37] = 0;
  pvVar2 = calloc(nmemb,size);
  if (pvVar2 != (void *)0x0) {
    return pvVar2;
  }
  abStack_40[0x30] = 0xe0;
  abStack_40[0x31] = 0x49;
  abStack_40[0x32] = 0x10;
  abStack_40[0x33] = 0;
  abStack_40[0x34] = 0;
  abStack_40[0x35] = 0;
  abStack_40[0x36] = 0;
  abStack_40[0x37] = 0;
  safe_calloc();
  abStack_40[0x20] = 0;
  abStack_40[0x21] = 0;
  abStack_40[0x22] = 0;
  abStack_40[0x23] = 0;
  abStack_40[0x24] = 0;
  abStack_40[0x25] = 0;
  abStack_40[0x26] = 0;
  abStack_40[0x27] = 0;
  abStack_40[0x28] = 0;
  abStack_40[0x29] = 0;
  abStack_40[0x2a] = 0;
  abStack_40[0x2b] = 0;
  abStack_40[0x2c] = 0;
  abStack_40[0x2d] = 0;
  abStack_40[0x2e] = 0;
  abStack_40[0x2f] = 0;
  abStack_40[0x30] = 0;
  abStack_40[0x31] = 0;
  abStack_40[0] = 0;
  abStack_40[1] = 0;
  abStack_40[2] = 0;
  abStack_40[3] = 0;
  abStack_40[4] = 0;
  abStack_40[5] = 0;
  abStack_40[6] = 0;
  abStack_40[7] = 0;
  abStack_40[8] = 0;
  abStack_40[9] = 0;
  abStack_40[10] = 0;
  abStack_40[0xb] = 0;
  abStack_40[0xc] = 0;
  abStack_40[0xd] = 0;
  abStack_40[0xe] = 0;
  abStack_40[0xf] = 0;
  abStack_40[0x10] = 0;
  abStack_40[0x11] = 0;
  abStack_40[0x12] = 0;
  abStack_40[0x13] = 0;
  abStack_40[0x14] = 0;
  abStack_40[0x15] = 0;
  abStack_40[0x16] = 0;
  abStack_40[0x17] = 0;
  abStack_40[0x18] = 0;
  abStack_40[0x19] = 0;
  abStack_40[0x1a] = 0;
  abStack_40[0x1b] = 0;
  abStack_40[0x1c] = 0;
  abStack_40[0x1d] = 0;
  abStack_40[0x1e] = 0;
  abStack_40[0x1f] = 0;
  uVar6 = extraout_RDX;
  while (iVar5 = (int)uVar6, iVar5 <= in_ECX) {
    iVar4 = iVar5 + 7;
    if (-1 < iVar5) {
      iVar4 = iVar5;
    }
    lVar3 = (long)(iVar4 >> 3);
    if (in_ECX - iVar5 < 7) {
      uVar1 = (uint)(byte)(7 - ((char)uVar6 - ((byte)iVar4 & 0xf8)));
      abStack_40[lVar3] =
           abStack_40[lVar3] |
           (byte)((*(byte *)(size + lVar3) >> (uVar1 & 0x1f) & 1) << (uVar1 & 0x1f));
      iVar4 = 1;
    }
    else {
      abStack_40[lVar3] = *(byte *)(size + lVar3);
      iVar4 = 8;
    }
    uVar6 = (ulong)(uint)(iVar5 + iVar4);
  }
  iVar5 = *(int *)(name + 0x14);
  iVar4 = iVar5 + 7;
  if (-1 < iVar5) {
    iVar4 = iVar5;
  }
  iVar4 = iVar4 >> 3;
  *(int *)(abStack_40 + iVar4) = *(int *)(name + 0x20) * *(int *)(name + 8) + in_R8D;
  if (iVar4 == -4) {
    uVar1 = 0x510f68cf;
  }
  else {
    uVar1 = 0x172a550d;
    lVar3 = 0;
    do {
      uVar1 = (uint)abStack_40[lVar3] + uVar1 * 0x172a554f;
      lVar3 = lVar3 + 1;
    } while (iVar4 + 4 != (int)lVar3);
    uVar1 = uVar1 ^ 0x46253dc2;
  }
  return (void *)((ulong)uVar1 % (ulong)*(uint *)(name + 0xc));
}

Assistant:

static void* safe_calloc(size_t nmemb, size_t size, const char* name) {
	void* ret;
	ret = calloc(nmemb, size);
	if (ret == NULL) {
		fprintf(stderr, "ERR: cannot alloc %s\n", name);
		exit(-1);
	}
	return ret;
}